

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_SIZE_T opj_tcd_get_encoded_tile_size(opj_tcd_t *p_tcd)

{
  uint local_34;
  OPJ_UINT32 l_remaining;
  OPJ_UINT32 l_size_comp;
  opj_tcd_tilecomp_t *l_tilec;
  opj_image_comp_t *l_img_comp;
  OPJ_SIZE_T l_data_size;
  OPJ_UINT32 i;
  opj_tcd_t *p_tcd_local;
  
  l_img_comp = (opj_image_comp_t *)0x0;
  _l_remaining = p_tcd->tcd_image->tiles->comps;
  l_tilec = (opj_tcd_tilecomp_t *)p_tcd->image->comps;
  for (l_data_size._4_4_ = 0; l_data_size._4_4_ < p_tcd->image->numcomps;
      l_data_size._4_4_ = l_data_size._4_4_ + 1) {
    local_34 = l_tilec->minimum_num_resolutions >> 3;
    if ((l_tilec->minimum_num_resolutions & 7) != 0) {
      local_34 = local_34 + 1;
    }
    if (local_34 == 3) {
      local_34 = 4;
    }
    l_img_comp = (opj_image_comp_t *)
                 ((long)&l_img_comp->dx +
                 (ulong)local_34 *
                 (long)(_l_remaining->x1 - _l_remaining->x0) *
                 (long)(_l_remaining->y1 - _l_remaining->y0));
    l_tilec = (opj_tcd_tilecomp_t *)&l_tilec->data_size_needed;
    _l_remaining = _l_remaining + 1;
  }
  return (OPJ_SIZE_T)l_img_comp;
}

Assistant:

OPJ_SIZE_T opj_tcd_get_encoded_tile_size(opj_tcd_t *p_tcd)
{
    OPJ_UINT32 i;
    OPJ_SIZE_T l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    OPJ_UINT32 l_size_comp, l_remaining;

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;
    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        l_data_size += l_size_comp * ((OPJ_SIZE_T)(l_tilec->x1 - l_tilec->x0) *
                                      (OPJ_SIZE_T)(l_tilec->y1 - l_tilec->y0));
        ++l_img_comp;
        ++l_tilec;
    }

    return l_data_size;
}